

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

bool tinyusdz::anon_unknown_240::HasInheritsRec
               (uint32_t depth,PrimSpec *primspec,uint32_t max_depth)

{
  pointer pPVar1;
  bool bVar2;
  PrimSpec *child;
  pointer primspec_00;
  
  if (max_depth < depth) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if ((primspec->_metas).inherits.has_value_ == false) {
      primspec_00 = (primspec->_children).
                    super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      pPVar1 = (primspec->_children).
               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (primspec_00 == pPVar1) {
        bVar2 = false;
      }
      else {
        do {
          bVar2 = HasInheritsRec(depth + 1,primspec_00,max_depth);
          if (bVar2) {
            return bVar2;
          }
          primspec_00 = primspec_00 + 1;
        } while (primspec_00 != pPVar1);
      }
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool HasInheritsRec(uint32_t depth, const PrimSpec &primspec,
                    const uint32_t max_depth = 1024 * 128) {
  if (depth > max_depth) {
    // too deep
    return false;
  }

  if (primspec.metas().inherits) {
    return true;
  }

  for (auto &child : primspec.children()) {
    if (HasInheritsRec(depth + 1, child, max_depth)) {
      return true;
    }
  }

  return false;
}